

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<SignedLongLong_Signed_Test>::CreateTest
          (ParameterizedTestFactory<SignedLongLong_Signed_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<long_long>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  SignedLongLong_Signed_Test::SignedLongLong_Signed_Test((SignedLongLong_Signed_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }